

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Reader * capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
                   (Reader *__return_storage_ptr__,PointerReader reader,ListSchema schema)

{
  Which elementType;
  ElementSize expectedElementSize;
  undefined8 uVar1;
  
  uVar1 = schema.elementType._0_8_;
  elementType = LIST;
  if (((undefined1  [16])schema.elementType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0)
  {
    elementType = schema.elementType.baseType;
  }
  expectedElementSize = anon_unknown_71::elementSizeFor(elementType);
  PointerReader::getList(&__return_storage_ptr__->reader,&reader,expectedElementSize,(word *)0x0);
  (__return_storage_ptr__->schema).elementType.baseType = (short)uVar1;
  (__return_storage_ptr__->schema).elementType.listDepth = (char)((ulong)uVar1 >> 0x10);
  (__return_storage_ptr__->schema).elementType.isImplicitParam = (bool)(char)((ulong)uVar1 >> 0x18);
  (__return_storage_ptr__->schema).elementType.field_3 =
       (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)uVar1 >> 0x20);
  *(short *)&(__return_storage_ptr__->schema).elementType.field_0x6 = (short)((ulong)uVar1 >> 0x30);
  (__return_storage_ptr__->schema).elementType.field_4.scopeId =
       (uint64_t)schema.elementType.field_4;
  return __return_storage_ptr__;
}

Assistant:

DynamicList::Reader PointerHelpers<DynamicList, Kind::OTHER>::getDynamic(
    PointerReader reader, ListSchema schema) {
  return DynamicList::Reader(schema,
      reader.getList(elementSizeFor(schema.whichElementType()), nullptr));
}